

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdquerymgr.cc
# Opt level: O2

void __thiscall bdQueryManager::clearQuery(bdQueryManager *this,bdNodeId *rmId)

{
  bdQuery *this_00;
  int iVar1;
  iterator __position;
  
  __position._M_node =
       (this->mLocalQueries).super__List_base<bdQuery_*,_std::allocator<bdQuery_*>_>._M_impl._M_node
       .super__List_node_base._M_next;
  while (__position._M_node != (_List_node_base *)&this->mLocalQueries) {
    iVar1 = operator==((bdNodeId *)__position._M_node[1]._M_next,rmId);
    if (iVar1 == 0) {
      __position._M_node = (__position._M_node)->_M_next;
    }
    else {
      this_00 = (bdQuery *)__position._M_node[1]._M_next;
      __position = std::__cxx11::list<bdQuery_*,_std::allocator<bdQuery_*>_>::erase
                             (&this->mLocalQueries,__position._M_node);
      if (this_00 != (bdQuery *)0x0) {
        bdQuery::~bdQuery(this_00);
      }
      operator_delete(this_00,0xf8);
    }
  }
  return;
}

Assistant:

void bdQueryManager::clearQuery(const bdNodeId *rmId) {
	std::list<bdQuery *>::iterator it;
	for (it = mLocalQueries.begin(); it != mLocalQueries.end();) {
		if ((*it)->mId == *rmId) {
			bdQuery *query = (*it);
			it = mLocalQueries.erase(it);
			delete query;
		} else
			it++;
	}
}